

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O2

void readsf_dsp(t_readsf *x,t_signal **sp)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = x->x_noutlets;
  pthread_mutex_lock((pthread_mutex_t *)&x->x_mutex);
  iVar2 = (*sp)->s_n;
  x->x_vecsize = iVar2;
  x->x_sigperiod = x->x_fifosize / (iVar2 * (x->x_sf).sf_bytesperframe);
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    x->x_outvec[uVar3] = sp[uVar3]->s_vec;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&x->x_mutex);
  dsp_add(readsf_perform,1,x);
  return;
}

Assistant:

static void readsf_dsp(t_readsf *x, t_signal **sp)
{
    int i, noutlets = x->x_noutlets;
    pthread_mutex_lock(&x->x_mutex);
    x->x_vecsize = sp[0]->s_n;
    x->x_sigperiod = x->x_fifosize / (x->x_sf.sf_bytesperframe * x->x_vecsize);
    for (i = 0; i < noutlets; i++)
        x->x_outvec[i] = sp[i]->s_vec;
    pthread_mutex_unlock(&x->x_mutex);
    dsp_add(readsf_perform, 1, x);
}